

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_thread.c
# Opt level: O0

int mk_http_thread_destroy(mk_http_thread *mth)

{
  mk_thread *ptr;
  void *ptr_00;
  mk_http_libco_params *libco_params;
  mk_thread *th;
  mk_http_thread *mth_local;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  ptr_00 = pthread_getspecific(mk_http_thread_libco_params);
  if (ptr_00 != (void *)0x0) {
    mk_mem_free(ptr_00);
    pthread_setspecific(mk_http_thread_libco_params,(void *)0x0);
  }
  mk_list_del(&mth->_head);
  ptr = mth->parent;
  mth->session->channel->event->type = 3;
  if (ptr->cb_destroy != (_func_void_void_ptr *)0x0) {
    (*ptr->cb_destroy)(ptr + 1);
  }
  co_delete(ptr->callee);
  mk_mem_free(ptr);
  return 0;
}

Assistant:

int mk_http_thread_destroy(struct mk_http_thread *mth)
{
    struct mk_thread *th;
    struct mk_http_libco_params *libco_params;

    libco_params = MK_TLS_GET(mk_http_thread_libco_params);

    if (libco_params != NULL) {
        mk_mem_free(libco_params);    
        MK_TLS_SET(mk_http_thread_libco_params, NULL);
    }

    /* Unlink from scheduler thread list */
    mk_list_del(&mth->_head);

    /* release original memory context */
    th = mth->parent;
    mth->session->channel->event->type = MK_EVENT_CONNECTION;
    mk_thread_destroy(th);

    return 0;
}